

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9MultiProve(Abc_Frame_t *pAbc,int argc,char **argv)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  Bmc_MulPar_t *pPars;
  Bmc_MulPar_t Pars;
  int c;
  Vec_Int_t *vStatuses;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  memset((Bmc_MulPar_t *)&pPars,0,0x24);
  pPars._0_4_ = 0x1e;
  pPars._4_4_ = 2;
  Pars.TimeOutGlo = 100;
  Pars.TimeOutLoc = 0;
  Pars.TimeOutInc = 0;
  Extra_UtilGetoptReset();
LAB_00260498:
  Pars.fVerbose = Extra_UtilGetopt(argc,argv,"TLMGHsdvwh");
  if (Pars.fVerbose == -1) {
    if (pAbc->pGia == (Gia_Man_t *)0x0) {
      Abc_Print(-1,"Abc_CommandAbc9MultiProve(): There is no AIG.\n");
      return 1;
    }
    iVar2 = Gia_ManRegNum(pAbc->pGia);
    if (iVar2 == 0) {
      Abc_Print(-1,"Abc_CommandAbc9MultiProve(): The problem is combinational.\n");
      return 1;
    }
    iVar2 = Gia_ManMultiProve(pAbc->pGia,(Bmc_MulPar_t *)&pPars);
    pAbc->Status = iVar2;
    register0x00000000 = Abc_FrameDeriveStatusArray(pAbc->pGia->vSeqModelVec);
    Abc_FrameReplacePoStatuses(pAbc,(Vec_Int_t **)&Pars.fVeryVerbose);
    Abc_FrameReplaceCexVec(pAbc,&pAbc->pGia->vSeqModelVec);
    return 0;
  }
  switch(Pars.fVerbose) {
  case 0x47:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-G\" should be followed by an integer.\n");
      goto LAB_00260821;
    }
    Pars.TimeOutLoc = atoi(argv[globalUtilOptind]);
    uVar1 = Pars.TimeOutLoc;
    break;
  case 0x48:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-H\" should be followed by an integer.\n");
      goto LAB_00260821;
    }
    Pars.TimeOutInc = atoi(argv[globalUtilOptind]);
    uVar1 = Pars.TimeOutInc;
    break;
  default:
    goto LAB_00260821;
  case 0x4c:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-L\" should be followed by an integer.\n");
      goto LAB_00260821;
    }
    pPars._4_4_ = atoi(argv[globalUtilOptind]);
    uVar1 = pPars._4_4_;
    break;
  case 0x4d:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-M\" should be followed by an integer.\n");
      goto LAB_00260821;
    }
    Pars.TimeOutGlo = atoi(argv[globalUtilOptind]);
    uVar1 = Pars.TimeOutGlo;
    break;
  case 0x54:
    if (globalUtilOptind < argc) goto LAB_00260506;
    Abc_Print(-1,"Command line switch \"-T\" should be followed by an integer.\n");
    goto LAB_00260821;
  case 100:
    Pars.TimePerOut = Pars.TimePerOut ^ 1;
    goto LAB_00260498;
  case 0x68:
    goto LAB_00260821;
  case 0x73:
    Pars.TimeOutGap = Pars.TimeOutGap ^ 1;
    goto LAB_00260498;
  case 0x76:
    Pars.fUseSyn = Pars.fUseSyn ^ 1;
    goto LAB_00260498;
  case 0x77:
    Pars.fDumpFinal = Pars.fDumpFinal ^ 1;
    goto LAB_00260498;
  }
  globalUtilOptind = globalUtilOptind + 1;
  if ((int)uVar1 < 1) goto LAB_00260821;
  goto LAB_00260498;
LAB_00260506:
  pPars._0_4_ = atoi(argv[globalUtilOptind]);
  globalUtilOptind = globalUtilOptind + 1;
  if ((int)(uint)pPars < 0) {
LAB_00260821:
    Abc_Print(-2,"usage: &mprove [-TLMGH num] [-sdvwh]\n");
    Abc_Print(-2,"\t         proves multi-output testcase by applying several engines\n");
    Abc_Print(-2,"\t-T num : approximate global runtime limit in seconds [default = %d]\n",
              (ulong)(uint)pPars);
    Abc_Print(-2,"\t-L num : approximate local runtime limit in seconds [default = %d]\n",
              (ulong)pPars._4_4_);
    Abc_Print(-2,"\t-M num : percentage of local runtime limit increase [default = %d]\n",
              (ulong)(uint)Pars.TimeOutGlo);
    Abc_Print(-2,"\t-G num : approximate gap runtime limit in seconds [default = %d]\n",
              (ulong)(uint)Pars.TimeOutLoc);
    Abc_Print(-2,"\t-H num : timeout per output in miliseconds [default = %d]\n",
              (ulong)(uint)Pars.TimeOutInc);
    pcVar3 = "no";
    if (Pars.TimeOutGap != 0) {
      pcVar3 = "yes";
    }
    Abc_Print(-2,"\t-s     : toggle using combinational synthesis [default = %s]\n",pcVar3);
    pcVar3 = "no";
    if (Pars.TimePerOut != 0) {
      pcVar3 = "yes";
    }
    Abc_Print(-2,"\t-d     : toggle dumping invariant into a file [default = %s]\n",pcVar3);
    pcVar3 = "no";
    if (Pars.fUseSyn != 0) {
      pcVar3 = "yes";
    }
    Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar3);
    pcVar3 = "no";
    if (Pars.fDumpFinal != 0) {
      pcVar3 = "yes";
    }
    Abc_Print(-2,"\t-w     : toggle printing additional verbose information [default = %s]\n",pcVar3
             );
    Abc_Print(-2,"\t-h     : print the command usage\n");
    return 1;
  }
  goto LAB_00260498;
}

Assistant:

int Abc_CommandAbc9MultiProve( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern int Gia_ManMultiProve( Gia_Man_t * p, Bmc_MulPar_t * pPars );
    Vec_Int_t * vStatuses; int c;
    Bmc_MulPar_t Pars, * pPars = &Pars;
    memset( pPars, 0, sizeof(Bmc_MulPar_t) );
    pPars->TimeOutGlo =  30;
    pPars->TimeOutLoc =   2;
    pPars->TimeOutInc = 100;
    pPars->TimeOutGap =   0;
    pPars->TimePerOut =   0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "TLMGHsdvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->TimeOutGlo = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->TimeOutGlo < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->TimeOutLoc = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->TimeOutLoc <= 0 )
                goto usage;
            break;
        case 'M':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-M\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->TimeOutInc = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->TimeOutInc <= 0 )
                goto usage;
            break;
        case 'G':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-G\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->TimeOutGap = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->TimeOutGap <= 0 )
                goto usage;
            break;
        case 'H':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-H\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->TimePerOut = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->TimePerOut <= 0 )
                goto usage;
            break;
        case 's':
            pPars->fUseSyn ^= 1;
            break;
        case 'd':
            pPars->fDumpFinal ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'w':
            pPars->fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9MultiProve(): There is no AIG.\n" );
        return 1;
    }
    if ( Gia_ManRegNum(pAbc->pGia) == 0 )
    {
        Abc_Print( -1, "Abc_CommandAbc9MultiProve(): The problem is combinational.\n" );
        return 1;
    }
    pAbc->Status = Gia_ManMultiProve( pAbc->pGia, pPars );
    vStatuses = Abc_FrameDeriveStatusArray( pAbc->pGia->vSeqModelVec );
    Abc_FrameReplacePoStatuses( pAbc, &vStatuses );        
    Abc_FrameReplaceCexVec( pAbc, &pAbc->pGia->vSeqModelVec );
    return 0;

usage:
    Abc_Print( -2, "usage: &mprove [-TLMGH num] [-sdvwh]\n" );
    Abc_Print( -2, "\t         proves multi-output testcase by applying several engines\n" );
    Abc_Print( -2, "\t-T num : approximate global runtime limit in seconds [default = %d]\n",     pPars->TimeOutGlo );
    Abc_Print( -2, "\t-L num : approximate local runtime limit in seconds [default = %d]\n",      pPars->TimeOutLoc );
    Abc_Print( -2, "\t-M num : percentage of local runtime limit increase [default = %d]\n",      pPars->TimeOutInc );
    Abc_Print( -2, "\t-G num : approximate gap runtime limit in seconds [default = %d]\n",        pPars->TimeOutGap );
    Abc_Print( -2, "\t-H num : timeout per output in miliseconds [default = %d]\n",               pPars->TimePerOut );
    Abc_Print( -2, "\t-s     : toggle using combinational synthesis [default = %s]\n",            pPars->fUseSyn?      "yes": "no" );
    Abc_Print( -2, "\t-d     : toggle dumping invariant into a file [default = %s]\n",            pPars->fDumpFinal?   "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n",             pPars->fVerbose?     "yes": "no" );
    Abc_Print( -2, "\t-w     : toggle printing additional verbose information [default = %s]\n",  pPars->fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}